

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *p,int fUseFanout,int fXorTrick)

{
  int *piVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  int *__s;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  Gia_Obj_t *pGVar12;
  Tim_Man_t *pTVar13;
  Gia_Man_t *pGVar14;
  long lVar15;
  Gia_Obj_t *pGVar16;
  uint uVar17;
  Gia_Obj_t *pGVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  Vec_Int_t *local_70;
  int local_64;
  
  local_64 = Gia_ManBoxNum(p);
  Gia_ManCleanPhase(p);
  lVar7 = (long)p->vCis->nSize;
  if (0 < lVar7) {
    lVar15 = 0;
    do {
      iVar5 = p->vCis->pArray[lVar15];
      if (((long)iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_005e42cc;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (((undefined1  [12])p->pObjs[iVar5] & (undefined1  [12])0x4000000040000000) !=
          (undefined1  [12])0x0) {
        __assert_fail("!pObj->fMark0 && !pObj->fMark1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x36c,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
      }
      lVar15 = lVar15 + 1;
    } while (lVar7 != lVar15);
  }
  lVar7 = (long)p->vCos->nSize;
  piVar1 = &p->nObjs;
  if (lVar7 < 1) {
    iVar5 = p->nObjs;
    if (iVar5 < 1) goto LAB_005e3ab0;
  }
  else {
    lVar15 = 0;
    do {
      iVar6 = p->vCos->pArray[lVar15];
      if (((long)iVar6 < 0) || (iVar5 = *piVar1, iVar5 <= iVar6)) {
LAB_005e42cc:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (((undefined1  [12])p->pObjs[iVar6] & (undefined1  [12])0x4000000040000000) !=
          (undefined1  [12])0x0) {
        __assert_fail("!pObj->fMark0 && !pObj->fMark1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x36e,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
      }
      lVar15 = lVar15 + 1;
    } while (lVar7 != lVar15);
  }
  pGVar18 = p->pObjs;
  if (pGVar18 != (Gia_Obj_t *)0x0) {
    lVar7 = 0;
    do {
      uVar19 = *(ulong *)pGVar18;
      uVar20 = uVar19 & 0x1fffffff;
      if (uVar20 != 0x1fffffff && -1 < (int)(uint)uVar19) {
        if ((~uVar19 & 0x4000000040000000) == 0) {
          __assert_fail("!pObj->fMark0 || !pObj->fMark1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                        ,0x371,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)")
          ;
        }
        if (((uint)uVar19 >> 0x1e & 1) != 0) {
          if ((long)*(ulong *)(pGVar18 + -uVar20) < 0) {
            __assert_fail("Gia_ObjFanin0(pObj)->fPhase == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                          ,0x374,
                          "Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
          }
          *(ulong *)(pGVar18 + -uVar20) = *(ulong *)(pGVar18 + -uVar20) | 0x8000000000000000;
          uVar19 = *(ulong *)pGVar18;
        }
        if ((uVar19 & 0x4000000000000000) != 0) {
          uVar19 = (ulong)((uint)(uVar19 >> 0x20) & 0x1fffffff);
          if ((long)*(ulong *)(pGVar18 + -uVar19) < 0) {
            __assert_fail("Gia_ObjFanin1(pObj)->fPhase == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                          ,0x379,
                          "Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
          }
          *(ulong *)(pGVar18 + -uVar19) = *(ulong *)(pGVar18 + -uVar19) | 0x8000000000000000;
        }
      }
      lVar7 = lVar7 + 1;
      iVar5 = *piVar1;
    } while ((lVar7 < iVar5) && (pGVar18 = p->pObjs + lVar7, p->pObjs != (Gia_Obj_t *)0x0));
  }
LAB_005e3ab0:
  if (fUseFanout == 0) {
    local_70 = (Vec_Int_t *)malloc(0x10);
    iVar6 = 0x10;
    if (0xe < iVar5 - 1U) {
      iVar6 = iVar5;
    }
    local_70->nCap = iVar6;
    if (iVar6 == 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((long)iVar6 << 2);
    }
    local_70->pArray = __s;
    local_70->nSize = iVar5;
    memset(__s,0xff,(long)iVar5 << 2);
    Gia_ManCreateRefs(p);
    uVar19 = (ulong)(uint)p->nObjs;
    if ((0 < p->nObjs) && (pGVar18 = p->pObjs, pGVar18 != (Gia_Obj_t *)0x0)) {
      lVar7 = 0;
      pGVar16 = pGVar18;
      do {
        uVar20 = *(ulong *)pGVar16;
        uVar21 = uVar20 & 0x1fffffff;
        if (uVar21 != 0x1fffffff && -1 < (int)(uint)uVar20) {
          if (((uint)uVar20 >> 0x1e & 1) == 0) {
            if ((uVar20 & 0x4000000000000000) == 0) goto LAB_005e4294;
            pGVar10 = (Gia_Obj_t *)
                      ((long)pGVar16 + (ulong)((uint)(uVar20 >> 0x1e) & 0x7ffffffc) * -3);
            if ((pGVar10 < pGVar18) || (pGVar18 + (uVar19 & 0xffffffff) <= pGVar10))
            goto LAB_005e42ad;
          }
          else {
            pGVar10 = (Gia_Obj_t *)((long)pGVar16 + (ulong)(uint)((int)uVar21 * 4) * -3);
            if ((pGVar10 < pGVar18) || (pGVar18 + (uVar19 & 0xffffffff) <= pGVar10))
            goto LAB_005e42ad;
            pGVar10 = pGVar18 + (lVar7 - uVar21);
          }
          p->pRefs[(int)((ulong)((long)pGVar10 - (long)pGVar18) >> 2) * -0x55555555] =
               p->pRefs[(int)((ulong)((long)pGVar10 - (long)pGVar18) >> 2) * -0x55555555] + -1;
        }
LAB_005e4294:
        lVar7 = lVar7 + 1;
        uVar19 = (ulong)*piVar1;
        pGVar16 = pGVar16 + 1;
      } while (lVar7 < (long)uVar19);
    }
  }
  else {
    local_70 = (Vec_Int_t *)0x0;
  }
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  if (1 < p->nObjs) {
    lVar15 = 1;
    lVar7 = 0x14;
    do {
      pGVar18 = p->pObjs;
      uVar19 = *(ulong *)((long)pGVar18 + lVar7 + -8);
      uVar4 = (uint)uVar19;
      if ((uVar4 & 0x9fffffff) == 0x9fffffff) {
        pGVar10 = Gia_ManAppendObj(p_00);
        uVar19 = *(ulong *)pGVar10;
        *(ulong *)pGVar10 = uVar19 | 0x9fffffff;
        *(ulong *)pGVar10 =
             uVar19 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar16 = p_00->pObjs;
        if ((pGVar10 < pGVar16) || (pGVar16 + p_00->nObjs <= pGVar10)) goto LAB_005e42ad;
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar16) >> 2) * -0x55555555);
        pGVar16 = p_00->pObjs;
        if ((pGVar10 < pGVar16) || (pGVar16 + p_00->nObjs <= pGVar10)) goto LAB_005e42ad;
        *(int *)(&pGVar18->field_0x0 + lVar7) =
             (int)((ulong)((long)pGVar10 - (long)pGVar16) >> 2) * 0x55555556;
      }
      else {
        iVar5 = (int)(uVar19 & 0x1fffffff);
        if ((uVar19 & 0x1fffffff) == 0x1fffffff || -1 < (int)uVar4) {
          if ((uVar19 & 0x4000000040000000) != 0) {
            if (((uint)(uVar19 >> 0x1e) & 1) == (uint)((uVar19 >> 0x3e & 1) != 0)) {
              __assert_fail("pObj->fMark0 != pObj->fMark1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                            ,0x39b,
                            "Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
            }
            pGVar16 = (Gia_Obj_t *)((long)pGVar18 + lVar7 + -8);
            if ((uVar19 >> 0x1e & 1) == 0) {
              uVar4 = Gia_ObjFanin1CopyCarry(local_70,pGVar16,(int)lVar15);
            }
            else {
              uVar4 = Gia_ObjFanin0CopyCarry(local_70,pGVar16,(int)lVar15);
            }
            uVar19 = *(ulong *)pGVar16;
            if (((uint)uVar19 >> 0x1e & 1) == 0) {
              uVar17 = *(uint *)((long)pGVar18 +
                                lVar7 + (ulong)(((uint)uVar19 & 0x1fffffff) << 2) * -3);
              if ((int)uVar17 < 0) goto LAB_005e42eb;
              uVar22 = (uint)(uVar19 >> 0x1d) & 7;
            }
            else {
              uVar17 = *(uint *)((long)pGVar18 +
                                lVar7 + (ulong)((uint)(uVar19 >> 0x1e) & 0x7ffffffc) * -3);
              if ((int)uVar17 < 0) goto LAB_005e42eb;
              uVar22 = (uint)(uVar19 >> 0x3d);
            }
            uVar17 = uVar22 & 1 ^ uVar17;
            uVar22 = uVar4 & 1;
            Gia_ManAppendCo(p_00,uVar4 & 0x7ffffffe);
            Gia_ManAppendCo(p_00,uVar17 ^ uVar22);
            Gia_ManAppendCo(p_00,uVar22);
            pGVar11 = Gia_ManAppendObj(p_00);
            uVar19 = *(ulong *)pGVar11;
            *(ulong *)pGVar11 = uVar19 | 0x9fffffff;
            *(ulong *)pGVar11 =
                 uVar19 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar10 = p_00->pObjs;
            if ((pGVar10 <= pGVar11) && (pGVar11 < pGVar10 + p_00->nObjs)) {
              Vec_IntPush(p_00->vCis,
                          (int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * -0x55555555);
              pGVar10 = p_00->pObjs;
              if ((pGVar10 <= pGVar11) && (pGVar11 < pGVar10 + p_00->nObjs)) {
                pGVar12 = Gia_ManAppendObj(p_00);
                uVar19 = *(ulong *)pGVar12;
                *(ulong *)pGVar12 = uVar19 | 0x9fffffff;
                *(ulong *)pGVar12 =
                     uVar19 & 0xe0000000ffffffff | 0x9fffffff |
                     (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
                pGVar3 = p_00->pObjs;
                if ((pGVar3 <= pGVar12) && (pGVar12 < pGVar3 + p_00->nObjs)) {
                  Vec_IntPush(p_00->vCis,
                              (int)((ulong)((long)pGVar12 - (long)pGVar3) >> 2) * -0x55555555);
                  pGVar3 = p_00->pObjs;
                  if ((pGVar3 <= pGVar12) && (pGVar12 < pGVar3 + p_00->nObjs)) {
                    uVar4 = (int)((ulong)((long)pGVar12 - (long)pGVar3) >> 2) * 0x55555556;
                    if ((int)uVar4 < 0) goto LAB_005e42eb;
                    uVar4 = uVar4 | uVar22;
                    *(uint *)(&pGVar18->field_0x0 + lVar7) = uVar4;
                    if ((fUseFanout == 0) && (*(long *)pGVar16 < 0)) {
                      if (local_70->nSize <= lVar15) {
                        __assert_fail("i >= 0 && i < p->nSize",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
                      }
                      local_70->pArray[lVar15] = uVar4;
                      pGVar3 = p->pObjs;
                      if ((pGVar16 < pGVar3) || (pGVar3 + *piVar1 <= pGVar16)) goto LAB_005e42ad;
                      if (0 < p->pRefs[(int)((ulong)((long)pGVar18 + (lVar7 - (long)pGVar3) + -8) >>
                                            2) * -0x55555555]) {
                        if (fXorTrick == 0) {
                          uVar19 = *(ulong *)((long)pGVar18 + lVar7 + -8);
                          uVar4 = *(uint *)((long)pGVar18 +
                                           (ulong)(((uint)uVar19 & 0x1fffffff) << 2) * -3 + lVar7);
                          if (((int)uVar4 < 0) ||
                             (uVar17 = *(uint *)((long)pGVar18 +
                                                lVar7 + (ulong)((uint)(uVar19 >> 0x1e) & 0x7ffffffc)
                                                        * -3), (int)uVar17 < 0)) goto LAB_005e42eb;
                          uVar4 = (uint)(uVar19 >> 0x1d) & 1 ^ uVar4;
                          uVar17 = uVar17 ^ (uint)(uVar19 >> 0x3d) & 1;
                        }
                        else {
                          uVar4 = (int)((ulong)((long)pGVar11 - (long)pGVar10) >> 2) * 0x55555556;
                          if ((int)uVar4 < 0) {
LAB_005e42eb:
                            __assert_fail("Lit >= 0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                          ,0xf5,"int Abc_LitNotCond(int, int)");
                          }
                          uVar4 = (uVar4 | uVar22) ^ 1;
                        }
                        iVar5 = Gia_ManAppendAnd(p_00,uVar4,uVar17);
                        *(int *)(&pGVar18->field_0x0 + lVar7) = iVar5;
                      }
                    }
                    local_64 = local_64 + 1;
                    goto LAB_005e40a0;
                  }
                }
              }
            }
LAB_005e42ad:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar4 = *(uint *)((long)pGVar18 + lVar7 + (ulong)(uint)(iVar5 << 2) * -3);
          if (((int)uVar4 < 0) ||
             (uVar17 = *(uint *)((long)pGVar18 +
                                lVar7 + (ulong)((uint)(uVar19 >> 0x1e) & 0x7ffffffc) * -3),
             (int)uVar17 < 0)) goto LAB_005e42eb;
          iVar5 = Gia_ManAppendAnd(p_00,uVar4 ^ (uint)(uVar19 >> 0x1d) & 1,
                                   uVar17 ^ (uint)(uVar19 >> 0x3d) & 1);
        }
        else {
          uVar17 = *(uint *)((long)pGVar18 + lVar7 + (ulong)(uint)(iVar5 << 2) * -3);
          if ((int)uVar17 < 0) goto LAB_005e42eb;
          iVar5 = Gia_ManAppendCo(p_00,uVar17 ^ uVar4 >> 0x1d & 1);
        }
        *(int *)(&pGVar18->field_0x0 + lVar7) = iVar5;
      }
LAB_005e40a0:
      lVar15 = lVar15 + 1;
      lVar7 = lVar7 + 0xc;
    } while (lVar15 < *piVar1);
  }
  Gia_ManCleanPhase(p);
  if (fUseFanout == 0) {
    if (local_70->pArray != (int *)0x0) {
      free(local_70->pArray);
    }
    free(local_70);
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  iVar5 = Gia_ManHasDangling(p_00);
  if (iVar5 != 0) {
    __assert_fail("!Gia_ManHasDangling(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                  ,0x3bc,"Gia_Man_t *Gia_ManDupWithArtificalFaddBoxes(Gia_Man_t *, int, int)");
  }
  iVar5 = Gia_ManBoxNum(p);
  if (iVar5 == 0) {
    iVar5 = p->vCis->nSize;
  }
  else {
    iVar5 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
  }
  iVar6 = Gia_ManBoxNum(p);
  if (iVar6 == 0) {
    iVar6 = p->vCos->nSize;
  }
  else {
    iVar6 = Tim_ManPoNum((Tim_Man_t *)p->pManTime);
  }
  pTVar13 = Gia_ManGenerateTim(iVar5,iVar6,local_64,3,2);
  p_00->pManTime = pTVar13;
  pGVar14 = Gia_ManGenerateExtraAig(local_64,3,2);
  p_00->pAigExtra = pGVar14;
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupWithArtificalFaddBoxes( Gia_Man_t * p, int fUseFanout, int fXorTrick )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;  
    int nBoxes = Gia_ManBoxNum(p);
    int i, nRealPis, nRealPos;
    Vec_Int_t * vCarries = NULL;
    // make sure two chains do not overlap
    Gia_ManCleanPhase( p );
    Gia_ManForEachCi( p, pObj, i )
        assert( !pObj->fMark0 && !pObj->fMark1 );
    Gia_ManForEachCo( p, pObj, i )
        assert( !pObj->fMark0 && !pObj->fMark1 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        assert( !pObj->fMark0 || !pObj->fMark1 );
        if ( pObj->fMark0 )
        {
            assert( Gia_ObjFanin0(pObj)->fPhase == 0 );
            Gia_ObjFanin0(pObj)->fPhase = 1;
        }
        if ( pObj->fMark1 )
        {
            assert( Gia_ObjFanin1(pObj)->fPhase == 0 );
            Gia_ObjFanin1(pObj)->fPhase = 1;
        }
    }
    // create mapping for carry-chains
    if ( !fUseFanout )
        vCarries = Vec_IntStartFull( Gia_ManObjNum(p) );
    // create references and discount carries
    if ( vCarries )
    {
        Gia_ManCreateRefs( p );
        Gia_ManForEachAnd( p, pObj, i )
            if ( pObj->fMark0 )
                Gia_ObjRefFanin0Dec( p, pObj );
            else if ( pObj->fMark1 )
                Gia_ObjRefFanin1Dec( p, pObj );
    }
    // if AIG already has (natural) FADD boxes, it should not un-normalized
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( !pObj->fMark0 && !pObj->fMark1 ) // AND-gate
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else // AND-gate with chain
        {
            int iCiLit, iOtherLit, iLit0, iLit1, iLit2, iXorLit;
            assert( pObj->fMark0 != pObj->fMark1 );
            iCiLit    = pObj->fMark0 ? Gia_ObjFanin0CopyCarry(vCarries, pObj, i) : Gia_ObjFanin1CopyCarry(vCarries, pObj, i);
            iOtherLit = pObj->fMark0 ? Gia_ObjFanin1Copy(pObj) : Gia_ObjFanin0Copy(pObj);
            assert( iCiLit >= 0 && iOtherLit >= 0 );
            iLit0 = Abc_LitNotCond( iCiLit,    Abc_LitIsCompl(iCiLit) );
            iLit1 = Abc_LitNotCond( iOtherLit, Abc_LitIsCompl(iCiLit) );
            iLit2 = Abc_LitNotCond( 0,         Abc_LitIsCompl(iCiLit) );
            // add COs
            assert( !Abc_LitIsCompl(iLit0) );
            Gia_ManAppendCo( pNew, iLit0 );
            Gia_ManAppendCo( pNew, iLit1 );
            Gia_ManAppendCo( pNew, iLit2 );
            // add CI (unused sum bit)
            iXorLit = Gia_ManAppendCi(pNew);
            // add CI (carry bit)
            pObj->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), Abc_LitIsCompl(iCiLit) );
            if ( vCarries && pObj->fPhase )
            {
                Vec_IntWriteEntry( vCarries, i, pObj->Value );
                if ( Gia_ObjRefNum(p, pObj) > 0 )
                {
                    if ( fXorTrick )
                        pObj->Value = Gia_ManAppendAnd( pNew, Abc_LitNotCond(iXorLit, !Abc_LitIsCompl(iCiLit)), iOtherLit );
                    else
                        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
                }
            }
            nBoxes++;
        }
    }
    Gia_ManCleanPhase( p );
    Vec_IntFreeP( &vCarries );
    ABC_FREE( p->pRefs );
    assert( !Gia_ManHasDangling(pNew) );
    // other information
//    nBoxes += (Gia_ManCiNum(pNew) - Gia_ManCiNum(p)) / 2;
//    assert( nBoxes == Gia_ManBoxNum(p) + (Gia_ManCoNum(pNew) - Gia_ManCoNum(p)) / 3 );
    nRealPis = Gia_ManBoxNum(p) ? Tim_ManPiNum((Tim_Man_t *)p->pManTime) : Gia_ManCiNum(p);
    nRealPos = Gia_ManBoxNum(p) ? Tim_ManPoNum((Tim_Man_t *)p->pManTime) : Gia_ManCoNum(p);
    pNew->pManTime  = Gia_ManGenerateTim( nRealPis, nRealPos, nBoxes, 3, 2 );
    pNew->pAigExtra = Gia_ManGenerateExtraAig( nBoxes, 3, 2 );
    // optionally normalize the AIG
    return pNew;
}